

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbMfs.c
# Opt level: O2

int Acb_NtkFindSupp2(Acb_Ntk_t *p,int Pivot,sat_solver *pSat,int nVars,int nDivs,Vec_Int_t *vWin,
                    Vec_Int_t *vSupp,int nLutSize,int fDelay)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  int *piVar5;
  int fCompl;
  undefined8 extraout_RDX;
  undefined8 uVar6;
  undefined8 extraout_RDX_00;
  long lVar7;
  long lVar8;
  
  piVar4 = Acb_ObjFanins(p,Pivot);
  lVar7 = 0;
  do {
    if (*piVar4 <= lVar7) {
      if (fDelay == 0) {
        piVar4 = Acb_ObjFanins(p,Pivot);
        lVar7 = 0;
        while( true ) {
          do {
            if (*piVar4 <= lVar7) {
              return 0;
            }
            iVar2 = piVar4[lVar7 + 1];
            lVar7 = lVar7 + 1;
            iVar1 = Acb_ObjIsAreaCritical(p,iVar2);
          } while (iVar1 == 0);
          vSupp->nSize = 0;
          piVar5 = Acb_ObjFanins(p,Pivot);
          for (lVar8 = 0; lVar8 < *piVar5; lVar8 = lVar8 + 1) {
            if (iVar2 != piVar5[lVar8 + 1]) {
              Vec_IntPush(vSupp,piVar5[lVar8 + 1]);
            }
          }
          piVar5 = Acb_ObjFanins(p,iVar2);
          for (lVar8 = 0; lVar8 < *piVar5; lVar8 = lVar8 + 1) {
            Vec_IntPushUnique(vSupp,piVar5[lVar8 + 1]);
          }
          Vec_IntSelectSortCost(vSupp->pArray,vSupp->nSize,&p->vLevelD);
          Acb_NtkRemapIntoSatVariables(p,vSupp);
          Vec_IntVars2Lits(vSupp,nVars * 2,fCompl);
          iVar2 = sat_solver_solve(pSat,vSupp->pArray,vSupp->pArray + vSupp->nSize,0,0,0,0);
          if (iVar2 != -1) break;
          iVar2 = sat_solver_minimize_assumptions(pSat,vSupp->pArray,vSupp->nSize,0);
          Vec_IntShrink(vSupp,iVar2);
          Vec_IntLits2Vars(vSupp,nVars * -2);
          if (vSupp->nSize <= nLutSize) {
            return 1;
          }
        }
        printf("Failed internal check at node %d.\n",(ulong)(uint)Pivot);
        __assert_fail("status == l_False",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acbMfs.c"
                      ,0x3e5,
                      "int Acb_NtkFindSupp2(Acb_Ntk_t *, int, sat_solver *, int, int, Vec_Int_t *, Vec_Int_t *, int, int)"
                     );
      }
      iVar2 = Acb_ObjLevelD(p,Pivot);
      if (iVar2 < 2) {
        __assert_fail("Acb_ObjLevelD( p, Pivot ) > 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acbMfs.c"
                      ,0x3b0,
                      "int Acb_NtkFindSupp2(Acb_Ntk_t *, int, sat_solver *, int, int, Vec_Int_t *, Vec_Int_t *, int, int)"
                     );
      }
      vSupp->nSize = 0;
      piVar4 = Acb_ObjFanins(p,Pivot);
      for (lVar7 = 0; lVar7 < *piVar4; lVar7 = lVar7 + 1) {
        iVar2 = piVar4[lVar7 + 1];
        iVar1 = Acb_ObjIsDelayCriticalFanin(p,Pivot,iVar2);
        if (iVar1 == 0) {
          Vec_IntPush(vSupp,iVar2);
        }
      }
      iVar2 = vSupp->nSize;
      piVar4 = Acb_ObjFanins(p,Pivot);
      lVar7 = 0;
      while (lVar7 < *piVar4) {
        iVar1 = piVar4[lVar7 + 1];
        lVar7 = lVar7 + 1;
        iVar3 = Acb_ObjIsDelayCriticalFanin(p,Pivot,iVar1);
        if (iVar3 != 0) {
          piVar5 = Acb_ObjFanins(p,iVar1);
          for (lVar8 = 0; lVar8 < *piVar5; lVar8 = lVar8 + 1) {
            Vec_IntPushUnique(vSupp,piVar5[lVar8 + 1]);
          }
        }
      }
      if (iVar2 < vSupp->nSize) {
        Vec_IntSelectSortCost(vSupp->pArray + iVar2,vSupp->nSize - iVar2,&p->vLevelD);
        uVar6 = extraout_RDX;
        for (iVar2 = 0; iVar2 < vSupp->nSize; iVar2 = iVar2 + 1) {
          iVar1 = Vec_IntEntry(vSupp,iVar2);
          iVar3 = Acb_ObjFunc(p,iVar1);
          if (iVar3 < 0) {
            __assert_fail("Acb_ObjFunc(p, iFanin) >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acbMfs.c"
                          ,0x3c1,
                          "int Acb_NtkFindSupp2(Acb_Ntk_t *, int, sat_solver *, int, int, Vec_Int_t *, Vec_Int_t *, int, int)"
                         );
          }
          iVar1 = Acb_ObjFunc(p,iVar1);
          Vec_IntWriteEntry(vSupp,iVar2,iVar1);
          uVar6 = extraout_RDX_00;
        }
        Vec_IntVars2Lits(vSupp,nVars * 2,(int)uVar6);
        iVar2 = sat_solver_solve(pSat,vSupp->pArray,vSupp->pArray + vSupp->nSize,0,0,0,0);
        if (iVar2 == -1) {
          iVar2 = sat_solver_minimize_assumptions(pSat,vSupp->pArray,vSupp->nSize,0);
          Vec_IntShrink(vSupp,iVar2);
          Vec_IntLits2Vars(vSupp,nVars * -2);
          return (uint)(vSupp->nSize <= nLutSize);
        }
        printf("Failed internal check at node %d.\n",(ulong)(uint)Pivot);
        __assert_fail("status == l_False",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acbMfs.c"
                      ,0x3c9,
                      "int Acb_NtkFindSupp2(Acb_Ntk_t *, int, sat_solver *, int, int, Vec_Int_t *, Vec_Int_t *, int, int)"
                     );
      }
      __assert_fail("nNonCrits < Vec_IntSize(vSupp)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acbMfs.c"
                    ,0x3bb,
                    "int Acb_NtkFindSupp2(Acb_Ntk_t *, int, sat_solver *, int, int, Vec_Int_t *, Vec_Int_t *, int, int)"
                   );
    }
    iVar2 = piVar4[lVar7 + 1];
    iVar1 = Acb_ObjFunc(p,iVar2);
    if (iVar1 < 0) break;
    iVar2 = Acb_ObjFunc(p,iVar2);
    lVar7 = lVar7 + 1;
  } while (iVar2 < nDivs);
  __assert_fail("Acb_ObjFunc(p, iFanin) >= 0 && Acb_ObjFunc(p, iFanin) < nDivs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acbMfs.c"
                ,0x3ab,
                "int Acb_NtkFindSupp2(Acb_Ntk_t *, int, sat_solver *, int, int, Vec_Int_t *, Vec_Int_t *, int, int)"
               );
}

Assistant:

int Acb_NtkFindSupp2( Acb_Ntk_t * p, int Pivot, sat_solver * pSat, int nVars, int nDivs, Vec_Int_t * vWin, Vec_Int_t * vSupp, int nLutSize, int fDelay )
{
    int nSuppNew, status, k, iFanin, * pFanins, k2, iFanin2, * pFanins2;
    Acb_ObjForEachFaninFast( p, Pivot, pFanins, iFanin, k )
        assert( Acb_ObjFunc(p, iFanin) >= 0 && Acb_ObjFunc(p, iFanin) < nDivs );
    if ( fDelay )
    {
        // add non-timing-critical fanins
        int nNonCrits, k2, iFanin2 = 0, * pFanins2;
        assert( Acb_ObjLevelD( p, Pivot ) > 1 );
        Vec_IntClear( vSupp );
        Acb_ObjForEachFaninFast( p, Pivot, pFanins, iFanin, k )
            if ( !Acb_ObjIsDelayCriticalFanin( p, Pivot, iFanin ) )
                Vec_IntPush( vSupp, iFanin );
        nNonCrits = Vec_IntSize(vSupp);
        // add fanins of timing critical fanins
        Acb_ObjForEachFaninFast( p, Pivot, pFanins, iFanin, k )
            if ( Acb_ObjIsDelayCriticalFanin( p, Pivot, iFanin ) )
                Acb_ObjForEachFaninFast( p, iFanin, pFanins2, iFanin2, k2 )
                    Vec_IntPushUnique( vSupp, iFanin2 );
        assert( nNonCrits < Vec_IntSize(vSupp) );
        // sort additional fanins by level
        Vec_IntSelectSortCost( Vec_IntArray(vSupp) + nNonCrits, Vec_IntSize(vSupp) - nNonCrits, &p->vLevelD );
        // translate to SAT vars
        Vec_IntForEachEntry( vSupp, iFanin, k )
        {
            assert( Acb_ObjFunc(p, iFanin) >= 0 );
            Vec_IntWriteEntry( vSupp, k, Acb_ObjFunc(p, iFanin) );
        }
        // solve for these fanins
        Vec_IntVars2Lits( vSupp, 2*nVars, 0 );
        status = sat_solver_solve( pSat, Vec_IntArray(vSupp), Vec_IntLimit(vSupp), 0, 0, 0, 0 );
        if ( status != l_False )
            printf( "Failed internal check at node %d.\n", Pivot );
        assert( status == l_False );
        nSuppNew = sat_solver_minimize_assumptions( pSat, Vec_IntArray(vSupp), Vec_IntSize(vSupp), 0 );
        Vec_IntShrink( vSupp, nSuppNew );
        Vec_IntLits2Vars( vSupp, -2*nVars );
        return Vec_IntSize(vSupp) <= nLutSize;
    }
    // iterate through different fanout free cones
    Acb_ObjForEachFaninFast( p, Pivot, pFanins, iFanin, k )
    {
        if ( !Acb_ObjIsAreaCritical(p, iFanin) )
            continue;
        // collect fanins of the root node
        Vec_IntClear( vSupp );
        Acb_ObjForEachFaninFast( p, Pivot, pFanins2, iFanin2, k2 )
            if ( iFanin != iFanin2 )
                Vec_IntPush( vSupp, iFanin2 );
        // collect fanins of the selected node
        Acb_ObjForEachFaninFast( p, iFanin, pFanins2, iFanin2, k2 )
            Vec_IntPushUnique( vSupp, iFanin2 );
        // sort fanins by level
        Vec_IntSelectSortCost( Vec_IntArray(vSupp), Vec_IntSize(vSupp), &p->vLevelD );
        //Acb_NtkOrderByRefCount( p, vSupp );
        Acb_NtkRemapIntoSatVariables( p, vSupp );
        // solve for these fanins
        Vec_IntVars2Lits( vSupp, 2*nVars, 0 );
        status = sat_solver_solve( pSat, Vec_IntArray(vSupp), Vec_IntLimit(vSupp), 0, 0, 0, 0 );
        if ( status != l_False )
            printf( "Failed internal check at node %d.\n", Pivot );
        assert( status == l_False );
        nSuppNew = sat_solver_minimize_assumptions( pSat, Vec_IntArray(vSupp), Vec_IntSize(vSupp), 0 );
        Vec_IntShrink( vSupp, nSuppNew );
        Vec_IntLits2Vars( vSupp, -2*nVars );
        if ( Vec_IntSize(vSupp) <= nLutSize )
            return 1;
    }
    return 0;
}